

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVisitor.cpp
# Opt level: O1

void __thiscall
llvm::DWARFYAML::VisitorImpl<const_llvm::DWARFYAML::Data>::traverseDebugInfo
          (VisitorImpl<const_llvm::DWARFYAML::Data> *this)

{
  uint32_t uVar1;
  pointer pUVar2;
  ulong N;
  pointer pEVar3;
  bool bVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  pointer pAVar7;
  undefined8 uVar8;
  raw_ostream *prVar9;
  Data *pDVar10;
  ulong uVar11;
  uint Size;
  long lVar12;
  pointer pFVar13;
  mapped_type mVar14;
  Form FVar15;
  ulong uVar16;
  ulong uVar17;
  pointer pAVar18;
  pointer pEVar19;
  pointer pUVar20;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  undefined1 local_128 [8];
  unordered_map<unsigned_long,_unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  abbrByteOffsetToDeclsIndex;
  ulong local_48;
  uint64_t offset;
  pointer local_38;
  
  local_128 = (undefined1  [8])&abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._M_next_resize;
  abbrByteOffsetToDeclsIndex._M_h._M_buckets = (__buckets_ptr)0x1;
  abbrByteOffsetToDeclsIndex._M_h._M_bucket_count = 0;
  abbrByteOffsetToDeclsIndex._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  abbrByteOffsetToDeclsIndex._M_h._M_element_count._0_4_ = 0x3f800000;
  abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._4_4_ = 0;
  abbrByteOffsetToDeclsIndex._M_h._M_rehash_policy._M_next_resize = 0;
  pDVar10 = this->DebugInfo;
  pAVar7 = (pDVar10->AbbrevDecls).
           super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pDVar10->AbbrevDecls).
      super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>._M_impl.
      super__Vector_impl_data._M_finish != pAVar7) {
    lVar12 = 0x28;
    mVar14 = 0;
    do {
      local_48 = *(ulong *)((long)&(pAVar7->Code).value + lVar12);
      sVar5 = std::
              _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::count((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)local_128,&local_48);
      if (sVar5 == 0) {
        pmVar6 = std::__detail::
                 _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)local_128,&local_48);
        *pmVar6 = mVar14;
      }
      mVar14 = mVar14 + 1;
      pDVar10 = this->DebugInfo;
      pAVar7 = (pDVar10->AbbrevDecls).
               super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x30;
    } while (mVar14 < (ulong)(((long)(pDVar10->AbbrevDecls).
                                     super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar7 >> 4)
                             * -0x5555555555555555));
  }
  pUVar20 = (pDVar10->CompileUnits).
            super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pUVar2 = (pDVar10->CompileUnits).
           super__Vector_base<llvm::DWARFYAML::Unit,_std::allocator<llvm::DWARFYAML::Unit>_>._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    if (pUVar20 == pUVar2) {
      std::
      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_128);
      return;
    }
    uVar16 = (ulong)pUVar20->AbbrOffset;
    local_48 = uVar16;
    sVar5 = std::
            _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::count((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_128,&local_48);
    if (sVar5 == 0) {
      __assert_fail("abbrByteOffsetToDeclsIndex.count(offset)",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVisitor.cpp"
                    ,0x56,
                    "void llvm::DWARFYAML::VisitorImpl<const llvm::DWARFYAML::Data>::traverseDebugInfo() [T = const llvm::DWARFYAML::Data]"
                   );
    }
    local_48 = uVar16;
    local_38 = pUVar20;
    pmVar6 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)local_128,&local_48);
    N = *pmVar6;
    pAVar7 = (this->DebugInfo->AbbrevDecls).
             super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pAVar7[N].ListOffset != uVar16) {
      __assert_fail("DebugInfo.AbbrevDecls[AbbrevStart].ListOffset == offset",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFVisitor.cpp"
                    ,0x58,
                    "void llvm::DWARFYAML::VisitorImpl<const llvm::DWARFYAML::Data>::traverseDebugInfo() [T = const llvm::DWARFYAML::Data]"
                   );
    }
    uVar11 = ((long)(this->DebugInfo->AbbrevDecls).
                    super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar7 >> 4) *
             -0x5555555555555555;
    uVar16 = N;
    if (N < uVar11) {
      pAVar7 = pAVar7 + N;
      uVar17 = N;
      do {
        uVar16 = uVar17;
        if ((pAVar7->Code).value == 0) break;
        uVar17 = uVar17 + 1;
        pAVar7 = pAVar7 + 1;
        uVar16 = uVar11;
      } while (uVar11 - uVar17 != 0);
    }
    if (N != uVar16) {
      (*this->_vptr_VisitorImpl[5])(this,local_38);
      pEVar19 = (local_38->Entries).
                super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pEVar3 = (local_38->Entries).
               super__Vector_base<llvm::DWARFYAML::Entry,_std::allocator<llvm::DWARFYAML::Entry>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (pEVar19 != pEVar3) {
        do {
          (*this->_vptr_VisitorImpl[7])(this,local_38,pEVar19);
          uVar1 = (pEVar19->AbbrCode).value;
          offset = (uint64_t)pEVar19;
          if (uVar1 != 0) {
            uVar11 = (uVar1 - 1) + N;
            if (uVar11 < uVar16) {
              pFVar13 = (pEVar19->Values).
                        super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (pFVar13 !=
                  (pEVar19->Values).
                  super__Vector_base<llvm::DWARFYAML::FormValue,_std::allocator<llvm::DWARFYAML::FormValue>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                pAVar7 = (this->DebugInfo->AbbrevDecls).
                         super__Vector_base<llvm::DWARFYAML::Abbrev,_std::allocator<llvm::DWARFYAML::Abbrev>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                pAVar18 = pAVar7[uVar11].Attributes.
                          super__Vector_base<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                do {
                  if (pAVar18 ==
                      pAVar7[uVar11].Attributes.
                      super__Vector_base<llvm::DWARFYAML::AttributeAbbrev,_std::allocator<llvm::DWARFYAML::AttributeAbbrev>_>
                      ._M_impl.super__Vector_impl_data._M_finish) break;
                  (*this->_vptr_VisitorImpl[9])(this,pAVar18,pFVar13);
                  FVar15 = pAVar18->Form;
                  do {
                    lVar12 = 0x68;
                    uVar8 = 0;
                    bVar4 = false;
                    switch(FVar15) {
                    case DW_FORM_addr:
                      Size = (uint)local_38->AddrSize;
                      goto LAB_00da2858;
                    case 2:
                    case DW_FORM_flag_present:
                    case DW_FORM_strx:
                    case DW_FORM_addrx:
                    case DW_FORM_data16:
                    case DW_FORM_implicit_const:
                    case DW_FORM_loclistx:
                    case DW_FORM_rnglistx:
                    case DW_FORM_strx3:
                    case DW_FORM_addrx3:
                      goto switchD_00da2804_caseD_2;
                    case DW_FORM_block2:
                      (*this->_vptr_VisitorImpl[0xb])
                                (this,(ulong)(*(int *)&(pFVar13->BlockData).
                                                                                                              
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              *(int *)&(pFVar13->BlockData).
                                                                                                              
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_start & 0xffff
                                             ));
                      (*this->_vptr_VisitorImpl[0x10])(this);
                      break;
                    case DW_FORM_block4:
                      (*this->_vptr_VisitorImpl[0xc])
                                (this,(ulong)(uint)(*(int *)&(pFVar13->BlockData).
                                                                                                                          
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  *(int *)&(pFVar13->BlockData).
                                                                                                                      
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_start));
                      (*this->_vptr_VisitorImpl[0x10])(this);
                      break;
                    case DW_FORM_data2:
                    case DW_FORM_ref2:
                    case DW_FORM_strx2:
                    case DW_FORM_addrx2:
                      (*this->_vptr_VisitorImpl[0xb])(this,(ulong)(ushort)(pFVar13->Value).value);
                      break;
                    case DW_FORM_data4:
                    case DW_FORM_ref4:
                    case DW_FORM_ref_sup4:
                    case DW_FORM_strx4:
                    case DW_FORM_addrx4:
                      (*this->_vptr_VisitorImpl[0xc])(this,(ulong)(uint)(pFVar13->Value).value);
                      break;
                    case DW_FORM_data8:
                    case DW_FORM_ref8:
                    case DW_FORM_ref_sig8:
                    case DW_FORM_ref_sup8:
                      goto switchD_00da2804_caseD_7;
                    case DW_FORM_string:
                      (*this->_vptr_VisitorImpl[0xf])
                                (this,(pFVar13->CStr).Data,(pFVar13->CStr).Length);
                      break;
                    case DW_FORM_block:
                    case DW_FORM_exprloc:
                      (*this->_vptr_VisitorImpl[0xd])
                                (this,(long)(pFVar13->BlockData).
                                            super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pFVar13->BlockData).
                                            super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                            ._M_impl.super__Vector_impl_data._M_start,1);
                      abbrByteOffsetToDeclsIndex._M_h._M_single_bucket =
                           (__node_base_ptr)
                           (pFVar13->BlockData).
                           super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>.
                           _M_impl.super__Vector_impl_data._M_start;
                      (*this->_vptr_VisitorImpl[0x10])(this);
                      break;
                    case DW_FORM_block1:
                      (*this->_vptr_VisitorImpl[10])
                                (this,(ulong)(*(int *)&(pFVar13->BlockData).
                                                                                                              
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              *(int *)&(pFVar13->BlockData).
                                                                                                              
                                                  super__Vector_base<llvm::yaml::Hex8,_std::allocator<llvm::yaml::Hex8>_>
                                                  ._M_impl.super__Vector_impl_data._M_start & 0xff))
                      ;
                      (*this->_vptr_VisitorImpl[0x10])(this);
                      break;
                    case DW_FORM_data1:
                    case DW_FORM_flag:
                    case DW_FORM_ref1:
                    case DW_FORM_strx1:
                    case DW_FORM_addrx1:
                      (*this->_vptr_VisitorImpl[10])(this,(ulong)(byte)(pFVar13->Value).value);
                      break;
                    case DW_FORM_sdata:
                      uVar8 = 1;
                      lVar12 = 0x70;
                      goto switchD_00da2804_caseD_7;
                    case DW_FORM_strp:
                    case DW_FORM_sec_offset:
                    case DW_FORM_strp_sup:
                    case DW_FORM_line_strp:
switchD_00da2804_caseD_e:
                      Size = (uint)((local_38->Length).TotalLength == 0xffffffff) * 4 + 4;
                      goto LAB_00da2858;
                    case DW_FORM_udata:
                    case DW_FORM_ref_udata:
switchD_00da2804_caseD_f:
                      uVar8 = 1;
switchD_00da2804_caseD_7:
                      (**(code **)((long)this->_vptr_VisitorImpl + lVar12))
                                (this,(pFVar13->Value).value,uVar8);
                      break;
                    case DW_FORM_ref_addr:
                      Size = (uint)((local_38->Length).TotalLength == 0xffffffff) * 4 + 4;
                      if (local_38->Version == 2) {
                        Size = (uint)local_38->AddrSize;
                      }
LAB_00da2858:
                      onVariableSizeValue(this,(pFVar13->Value).value,Size);
                      break;
                    case DW_FORM_indirect:
                      (*this->_vptr_VisitorImpl[0xd])(this,(pFVar13->Value).value,1);
                      FVar15 = (Form)(pFVar13->Value).value;
                      pFVar13 = pFVar13 + 1;
                      bVar4 = true;
                      goto switchD_00da2804_caseD_2;
                    default:
                      if (FVar15 - 0x1f01 < 2) goto switchD_00da2804_caseD_f;
                      if (FVar15 - 0x1f20 < 2) goto switchD_00da2804_caseD_e;
                      goto switchD_00da2804_caseD_2;
                    }
                    bVar4 = false;
switchD_00da2804_caseD_2:
                  } while (bVar4);
                  pFVar13 = pFVar13 + 1;
                  pAVar18 = pAVar18 + 1;
                } while (pFVar13 != *(pointer *)(offset + 0x10));
              }
              (*this->_vptr_VisitorImpl[8])(this,local_38,offset);
            }
            else {
              prVar9 = errs();
              Str.Length = 0x23;
              Str.Data = "warning: invalid abbreviation code ";
              prVar9 = raw_ostream::operator<<(prVar9,Str);
              prVar9 = raw_ostream::operator<<(prVar9,(ulong)*(uint *)offset);
              Str_00.Length = 9;
              Str_00.Data = " (range: ";
              prVar9 = raw_ostream::operator<<(prVar9,Str_00);
              prVar9 = raw_ostream::operator<<(prVar9,N);
              Str_01.Length = 2;
              Str_01.Data = "..";
              prVar9 = raw_ostream::operator<<(prVar9,Str_01);
              prVar9 = raw_ostream::operator<<(prVar9,uVar16);
              Str_02.Length = 2;
              Str_02.Data = ")\n";
              raw_ostream::operator<<(prVar9,Str_02);
            }
          }
          pEVar19 = (pointer)(offset + 0x20);
        } while (pEVar19 != pEVar3);
        (*this->_vptr_VisitorImpl[6])(this,local_38);
      }
    }
    pUVar20 = local_38 + 1;
  } while( true );
}

Assistant:

void DWARFYAML::VisitorImpl<T>::traverseDebugInfo() {
  // XXX BINARYEN: Handle multiple linked compile units, each of which can
  // refer to a different abbreviation list.
  // TODO: This code appears to assume that abbreviation codes increment by 1
  // so that lookups are linear. In LLVM output that is true, but it might not
  // be in general.
  // Create a map of [byte offset into the abbreviation section] => [index in
  // DebugInfo.AbbrevDecls]. This avoids linear search for each CU.
  std::unordered_map<size_t, size_t> abbrByteOffsetToDeclsIndex;
  for (size_t i = 0; i < DebugInfo.AbbrevDecls.size(); i++) {
    auto offset = DebugInfo.AbbrevDecls[i].ListOffset;
    // The offset is the same for all entries for the same CU, so only note the
    // first as that is where the list for the CU (that LLVM DeclSet) begins.
    // That is, DebugInfo.AbbrevDecls looks like this:
    //
    //  i  CU   Abbrev  ListOffset
    // ============================
    //  0   X     X1      150
    //  1   X     X2      150
    //  2   X     X3      150
    //           ..
    //  6   Y     Y1      260
    //  7   Y     Y2      260
    //
    // Note how multiple rows i have the same CU. All those abbrevs have the
    // same ListOffset, which is the byte offset into the abbreviation section
    // for that set of abbreviations.
    if (abbrByteOffsetToDeclsIndex.count(offset)) {
      continue;
    }
    abbrByteOffsetToDeclsIndex[offset] = i;
  }
  for (auto &Unit : DebugInfo.CompileUnits) {
    // AbbrOffset is the byte offset into the abbreviation section, which we
    // need to find among the Abbrev's ListOffsets (which are the byte offsets
    // of where that abbreviation list begins).
    // TODO: Optimize this to not be O(#CUs * #abbrevs).
    auto offset = Unit.AbbrOffset;
    assert(abbrByteOffsetToDeclsIndex.count(offset));
    size_t AbbrevStart = abbrByteOffsetToDeclsIndex[offset];
    assert(DebugInfo.AbbrevDecls[AbbrevStart].ListOffset == offset);
    // Find the last entry in this abbreviation list.
    size_t AbbrevEnd = AbbrevStart;
    while (AbbrevEnd < DebugInfo.AbbrevDecls.size() &&
           DebugInfo.AbbrevDecls[AbbrevEnd].Code) {
      AbbrevEnd++;
    }
    // XXX BINARYEN If there are no abbreviations, there is nothing to
    //              do in this unit.
    if (AbbrevStart == AbbrevEnd) {
      continue;
    }
    onStartCompileUnit(Unit);
    if (Unit.Entries.empty()) { // XXX BINARYEN
      continue;
    }
    for (auto &Entry : Unit.Entries) {
      onStartDIE(Unit, Entry);
      if (Entry.AbbrCode == 0u)
        continue;
      // XXX BINARYEN valid abbreviation codes start from 1, so subtract that,
      //              and are relative to the start of the abbrev table
      auto RelativeAbbrIndex = Entry.AbbrCode - 1 + AbbrevStart;
      if (RelativeAbbrIndex >= AbbrevEnd) {
        errs() << "warning: invalid abbreviation code " << Entry.AbbrCode
               << " (range: " << AbbrevStart << ".." << AbbrevEnd << ")\n";
        continue;
      }
      auto &Abbrev = DebugInfo.AbbrevDecls[RelativeAbbrIndex];
      auto FormVal = Entry.Values.begin();
      auto AbbrForm = Abbrev.Attributes.begin();
      for (;
           FormVal != Entry.Values.end() && AbbrForm != Abbrev.Attributes.end();
           ++FormVal, ++AbbrForm) {
        onForm(*AbbrForm, *FormVal);
        dwarf::Form Form = AbbrForm->Form;
        bool Indirect;
        do {
          Indirect = false;
          switch (Form) {
          case dwarf::DW_FORM_addr:
            onVariableSizeValue(FormVal->Value, Unit.AddrSize);
            break;
          case dwarf::DW_FORM_ref_addr:
            onVariableSizeValue(FormVal->Value, getRefSize(Unit));
            break;
          case dwarf::DW_FORM_exprloc:
          case dwarf::DW_FORM_block:
            onValue((uint64_t)FormVal->BlockData.size(), true);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          case dwarf::DW_FORM_block1: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint8_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_block2: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint16_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_block4: {
            auto writeSize = FormVal->BlockData.size();
            onValue((uint32_t)writeSize);
            onValue(
                MemoryBufferRef(StringRef((const char *)FormVal->BlockData.data(),
                                          FormVal->BlockData.size()),
                                ""));
            break;
          }
          case dwarf::DW_FORM_data1:
          case dwarf::DW_FORM_ref1:
          case dwarf::DW_FORM_flag:
          case dwarf::DW_FORM_strx1:
          case dwarf::DW_FORM_addrx1:
            onValue((uint8_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data2:
          case dwarf::DW_FORM_ref2:
          case dwarf::DW_FORM_strx2:
          case dwarf::DW_FORM_addrx2:
            onValue((uint16_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data4:
          case dwarf::DW_FORM_ref4:
          case dwarf::DW_FORM_ref_sup4:
          case dwarf::DW_FORM_strx4:
          case dwarf::DW_FORM_addrx4:
            onValue((uint32_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_data8:
          case dwarf::DW_FORM_ref8:
          case dwarf::DW_FORM_ref_sup8:
            onValue((uint64_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_sdata:
            onValue((int64_t)FormVal->Value, true);
            break;
          case dwarf::DW_FORM_udata:
          case dwarf::DW_FORM_ref_udata:
            onValue((uint64_t)FormVal->Value, true);
            break;
          case dwarf::DW_FORM_string:
            onValue(FormVal->CStr);
            break;
          case dwarf::DW_FORM_indirect:
            onValue((uint64_t)FormVal->Value, true);
            Indirect = true;
            Form = static_cast<dwarf::Form>((uint64_t)FormVal->Value);
            ++FormVal;
            break;
          case dwarf::DW_FORM_strp:
          case dwarf::DW_FORM_sec_offset:
          case dwarf::DW_FORM_GNU_ref_alt:
          case dwarf::DW_FORM_GNU_strp_alt:
          case dwarf::DW_FORM_line_strp:
          case dwarf::DW_FORM_strp_sup:
            onVariableSizeValue(FormVal->Value, getOffsetSize(Unit));
            break;
          case dwarf::DW_FORM_ref_sig8:
            onValue((uint64_t)FormVal->Value);
            break;
          case dwarf::DW_FORM_GNU_addr_index:
          case dwarf::DW_FORM_GNU_str_index:
            onValue((uint64_t)FormVal->Value, true);
            break;
          default:
            break;
          }
        } while (Indirect);
      }
      onEndDIE(Unit, Entry);
    }
    onEndCompileUnit(Unit);
  }
}